

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simpleserver.hpp
# Opt level: O3

StateStatus __thiscall SimpleServer::HttpParser::removeLeadingSpaces(HttpParser *this)

{
  string *this_00;
  size_t sVar1;
  StateStatus SVar2;
  long *local_38 [2];
  long local_28 [2];
  
  this_00 = &this->request;
  sVar1 = std::__cxx11::string::find_last_of((char *)this_00,0x109861,this->pos);
  this->pos = sVar1;
  if (sVar1 == 0xffffffffffffffff) {
    SVar2 = FAIL;
  }
  else {
    if (sVar1 == (this->request)._M_string_length - 1) {
      return READING;
    }
    std::__cxx11::string::substr((ulong)local_38,(ulong)this_00);
    std::__cxx11::string::operator=((string *)this_00,(string *)local_38);
    if (local_38[0] != local_28) {
      operator_delete(local_38[0],local_28[0] + 1);
    }
    SVar2 = OK;
  }
  this->pos = 0;
  return SVar2;
}

Assistant:

StateStatus removeLeadingSpaces()
		{
			pos = request.find_last_of(SPACES, pos);

			if (pos != std::string::npos)
			{
				if (pos == request.size() - 1)
					return READING;

				request = request.substr(pos + 1);
				pos = 0;

				return OK;
			}
			else
			{
				pos = 0;
				return FAIL;
			}
		}